

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O3

int bfgs_min_naive(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,double *dx,
                  double fsval,double maxstep,int MAXITER,double eps,double *xf)

{
  size_t __size;
  double dVar1;
  double gtol;
  double eps2;
  int iVar2;
  int retval;
  int iVar3;
  double *f;
  double *array;
  double *xi_00;
  double *x;
  double *A;
  double *L;
  double *f_00;
  ulong uVar4;
  double *pdVar5;
  char *__format;
  ulong uVar6;
  size_t __size_00;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int local_68;
  
  __size = (long)N * 8;
  f = (double *)malloc(__size);
  array = (double *)malloc(__size);
  xi_00 = (double *)malloc(__size);
  x = (double *)malloc(__size);
  __size_00 = (long)N * __size;
  A = (double *)malloc(__size_00);
  L = (double *)malloc(__size_00);
  f_00 = (double *)malloc(__size);
  gtol = pow(eps,0.3333333333333333);
  if (eps < 0.0) {
    eps2 = sqrt(eps);
  }
  else {
    eps2 = SQRT(eps);
  }
  if (0 < N) {
    uVar4 = 0;
    do {
      xi[uVar4] = dx[uVar4] * xi[uVar4];
      dx[uVar4] = 1.0 / dx[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)N != uVar4);
  }
  dVar8 = (*funcpt->funcpt)(xi,N,funcpt->params);
  dVar9 = ABS(dVar8);
  local_68 = 0;
  if (1.79769313486232e+308 <= dVar9) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    local_68 = 0xf;
  }
  if (NAN(dVar8)) {
    printf("Program Exiting as the function returns NaN");
    local_68 = 0xf;
  }
  iVar2 = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,f);
  if (iVar2 == 0xf) {
    local_68 = 0xf;
  }
  dVar8 = 0.0;
  if (maxstep <= 0.0) {
    dVar10 = 0.0;
    if (0 < N) {
      uVar4 = 0;
      dVar10 = 0.0;
      do {
        dVar1 = dx[uVar4];
        dVar10 = dVar10 + dVar1 * dVar1;
        dVar8 = dVar8 + dVar1 * xi[uVar4] * dVar1 * xi[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uint)N != uVar4);
    }
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    if (dVar10 <= dVar8) {
      maxstep = dVar8 * 1000.0;
    }
    else {
      maxstep = dVar10 * 1000.0;
    }
  }
  if (N < 1) {
    dVar9 = array_max_abs(array,N);
    if (dVar9 <= gtol * 0.001) {
      return 1;
    }
  }
  else {
    dVar8 = dVar9;
    if (dVar9 <= ABS(fsval)) {
      dVar8 = ABS(fsval);
    }
    uVar7 = (ulong)(uint)N;
    uVar4 = 0;
    do {
      dVar10 = ABS(xi[uVar4]);
      if (ABS(xi[uVar4]) <= 1.0 / ABS(dx[uVar4])) {
        dVar10 = 1.0 / ABS(dx[uVar4]);
      }
      array[uVar4] = (ABS(f[uVar4]) * dVar10) / dVar8;
      uVar4 = uVar4 + 1;
    } while (uVar7 != uVar4);
    dVar8 = array_max_abs(array,N);
    if (dVar8 <= gtol * 0.001) {
      if (0 < N) {
        uVar4 = 0;
        do {
          xf[uVar4] = xi[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar7 != uVar4);
      }
      return 1;
    }
    if (0 < N) {
      if (dVar9 <= fsval) {
        dVar9 = fsval;
      }
      uVar4 = 0;
      pdVar5 = A;
      do {
        uVar6 = 0;
        do {
          if (uVar4 == uVar6) {
            A[uVar4 + uVar4 * uVar7] = dVar9 * dx[uVar4] * dx[uVar4];
          }
          else {
            pdVar5[uVar6] = 0.0;
          }
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
        uVar4 = uVar4 + 1;
        pdVar5 = pdVar5 + uVar7;
      } while (uVar4 != uVar7);
      if (0 < N) {
        memcpy(xi_00,xi,uVar7 << 3);
      }
    }
  }
  iVar2 = 0;
  if (0 < MAXITER && local_68 == 0) {
    iVar2 = 0;
    do {
      modelhess(A,N,dx,eps,L);
      scale(f,1,N,-1.0);
      linsolve_lower(L,N,f,x);
      scale(f,1,N,-1.0);
      retval = lnsrch(funcpt,xi_00,f,x,N,dx,maxstep,gtol * gtol,xf);
      dVar9 = (*funcpt->funcpt)(xf,N,funcpt->params);
      if (1.79769313486232e+308 <= ABS(dVar9)) {
        __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_0012dcd5:
        printf(__format);
LAB_0012dcdc:
        iVar2 = 0xf;
        goto LAB_0012dce5;
      }
      if (NAN(dVar9)) {
        __format = "Program Exiting as the function returns NaN";
        goto LAB_0012dcd5;
      }
      iVar3 = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,f_00);
      if (iVar3 == 0xf) goto LAB_0012dcdc;
      local_68 = stopcheck(dVar9,N,xi_00,xf,f_00,dx,fsval,gtol,gtol * gtol,retval);
      bfgs_naive(A,N,eps,xi_00,xf,f,f_00);
      if (0 < N) {
        memcpy(xi_00,xf,(ulong)(uint)N << 3);
        memcpy(f,f_00,(ulong)(uint)N << 3);
      }
      iVar2 = iVar2 + 1;
    } while ((local_68 == 0) && (iVar2 < MAXITER));
  }
  iVar2 = (uint)(MAXITER <= iVar2) << 2;
  if (local_68 != 0) {
    iVar2 = local_68;
  }
LAB_0012dce5:
  free(f);
  free(A);
  free(array);
  free(xi_00);
  free(L);
  free(x);
  free(f_00);
  return iVar2;
}

Assistant:

int bfgs_min_naive(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, double *dx, double fsval, double maxstep, int MAXITER,
		double eps,double *xf)  {
	int rcode,iter,gfdcode;
	int i,siter,retval;
	double gtol,stol,dt1,dt2;
	double fx,num,den,stop0,fxf,eps2;
	double *jac,*hess,*scheck,*xc,*L,*step,*jacf;
	
	jac = (double*) malloc(sizeof(double) *N);
	scheck = (double*) malloc(sizeof(double) *N);
	xc = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	hess = (double*) malloc(sizeof(double) *N * N);
	L = (double*) malloc(sizeof(double) *N * N);
	jacf = (double*) malloc(sizeof(double) *N);
	
	/*
	 * Return Codes
	 * 
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 * 
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 * 
	 */ 
	
	rcode = 0;
	iter = 0;
	siter = MAXITER;
	gtol = pow(eps,1.0/3.0);
	
	stol = gtol * gtol;
	eps2 = sqrt(eps);
	gfdcode = 0;
	//set values
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt,xi,N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}
	
	gfdcode = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,jac);
	if (gfdcode == 15) {
		rcode = 15;
	}
	
	
	//maxstep = 1000.0; // Needs to be set at a much higher value proportional to l2 norm of dx

	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);

		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}
	
	//printf("dt1 dt2 %g \n", maxstep);

	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}
	
	stop0 = array_max_abs(scheck,N);
	
	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for(i = 0; i < N;++i) {
			xf[i] = xi[i];
		}
		return rcode;
	}
	
	//hessian_fd(funcpt,xi,N,dx,hess);
	inithess_naive(hess,N,fx,fsval,dx);
	
	for(i = 0; i < N;++i) {
		xc[i] = xi[i];
	}
	
	while (rcode == 0 && iter < siter) {
		iter++;
		modelhess(hess,N,dx,eps,L);
		scale(jac,1,N,-1.0);
		//mdisplay(hess,N,N);
		
		linsolve_lower(L,N,jac,step);
		
		scale(jac,1,N,-1.0);
		//retval = lnsrchmod(funcpt,xc,jac,step,N,dx,maxstep,stol,xf,jacf); 
		retval = lnsrch(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);
		
		//retval = swolfe(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);
		
		fxf = FUNCPT_EVAL(funcpt,xf,N);
		if (fxf >= DBL_MAX || fxf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			rcode = 15;
			break;
		}
		if (fxf != fxf) {
			printf("Program Exiting as the function returns NaN");
			rcode = 15;
			break;
		}
		//printf("%d %g \n",iter,fxf);
		gfdcode = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,jacf);
		if (gfdcode == 15) {
			rcode = 15;
			break;
		}
		rcode = stopcheck(fxf,N,xc,xf,jacf,dx,fsval,gtol,stol,retval);
		//hessian_fd(funcpt,xf,N,dx,hess);
		bfgs_naive(hess,N,eps,xc,xf,jac,jacf);
		for(i = 0; i < N;++i) {
			xc[i] = xf[i];
			jac[i] = jacf[i];
		}
	}
	
	if (rcode == 0 && iter >= siter) {
		rcode = 4;
	}
	/*
	for(i = 0; i < N;++i) {
		xf[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	*/
	free(jac);
	free(hess);
	free(scheck);
	free(xc);
	free(L);
	free(step);
	free(jacf);
	return rcode;
}